

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alldiff.cpp
# Opt level: O3

void __thiscall AllDiffBoundsImp<4>::sortit(AllDiffBoundsImp<4> *this)

{
  int iVar1;
  IntView<4> *pIVar2;
  int *piVar3;
  int *piVar4;
  bool bVar5;
  ulong uVar6;
  int *piVar7;
  interval *piVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  int *piVar17;
  
  iVar11 = this->sz;
  if (0 < (long)iVar11) {
    piVar7 = this->minsorted;
    pIVar2 = this->x;
    piVar8 = this->iv;
    uVar12 = (ulong)(iVar11 - 1);
    uVar6 = (long)iVar11;
    do {
      iVar11 = piVar7[uVar6 - 1];
      piVar8[iVar11].min = pIVar2[iVar11].b + ((pIVar2[iVar11].var)->min).v;
      uVar15 = uVar6 - 1;
      if ((long)uVar6 < (long)this->sz) {
        uVar15 = uVar12;
        do {
          if (piVar8[iVar11].min < piVar8[piVar7[uVar15 + 1]].min) break;
          piVar7[uVar15] = piVar7[uVar15 + 1];
          uVar15 = uVar15 + 1;
        } while ((int)uVar15 < this->sz + -1);
      }
      piVar7[uVar15 & 0xffffffff] = iVar11;
      uVar12 = uVar12 - 1;
      bVar5 = 1 < (long)uVar6;
      uVar6 = uVar6 - 1;
    } while (bVar5);
    iVar11 = this->sz;
    if (0 < (long)iVar11) {
      piVar7 = this->maxsorted;
      pIVar2 = this->x;
      piVar8 = this->iv;
      uVar12 = (ulong)(iVar11 - 1);
      uVar6 = (long)iVar11;
      do {
        iVar11 = piVar7[uVar6 - 1];
        piVar8[iVar11].max = pIVar2[iVar11].b + ((pIVar2[iVar11].var)->max).v + 1;
        uVar15 = uVar6 - 1;
        if ((long)uVar6 < (long)this->sz) {
          uVar15 = uVar12;
          do {
            if (piVar8[iVar11].max < piVar8[piVar7[uVar15 + 1]].max) break;
            piVar7[uVar15] = piVar7[uVar15 + 1];
            uVar15 = uVar15 + 1;
          } while ((int)uVar15 < this->sz + -1);
        }
        piVar7[uVar15 & 0xffffffff] = iVar11;
        uVar12 = uVar12 - 1;
        bVar5 = 1 < (long)uVar6;
        uVar6 = uVar6 - 1;
      } while (bVar5);
      goto LAB_00156d4d;
    }
  }
  piVar8 = this->iv;
  piVar7 = this->maxsorted;
LAB_00156d4d:
  piVar3 = this->minsorted;
  piVar4 = this->bounds;
  iVar16 = piVar8[*piVar3].min;
  iVar1 = piVar8[*piVar7].max;
  iVar11 = iVar16 + -2;
  *piVar4 = iVar11;
  this->nb = 0;
  iVar10 = this->sz;
  iVar13 = 0;
  iVar14 = 0;
  iVar9 = 0;
LAB_00156d8f:
  do {
    piVar17 = piVar3 + iVar9;
    do {
      if ((iVar10 <= iVar9) || (iVar1 < iVar16)) {
        if (iVar1 != iVar11) {
          this->nb = iVar13 + 1;
          piVar4[(long)iVar13 + 1] = iVar1;
          iVar10 = this->sz;
          iVar13 = this->nb;
        }
        piVar8[piVar7[iVar14]].maxrank = iVar13;
        iVar14 = iVar14 + 1;
        if (iVar14 == iVar10) {
          piVar4[(long)iVar13 + 1] = piVar4[iVar13] + 2;
          return;
        }
        iVar11 = iVar1;
        iVar1 = piVar8[piVar7[iVar14]].max;
        goto LAB_00156d8f;
      }
      if (iVar16 != iVar11) {
        this->nb = iVar13 + 1;
        piVar4[(long)iVar13 + 1] = iVar16;
        iVar10 = this->sz;
        iVar13 = this->nb;
      }
      piVar8[*piVar17].minrank = iVar13;
      iVar9 = iVar9 + 1;
      piVar17 = piVar17 + 1;
      iVar11 = iVar16;
    } while (iVar10 <= iVar9);
    iVar16 = piVar8[piVar3[iVar9]].min;
  } while( true );
}

Assistant:

void sortit() {
		int i;
		int j;
		int min;
		int max;
		int last;

		for (int i = sz - 1; i >= 0; --i) {
			const int t = minsorted[i];
			iv[t].min = static_cast<int>(x[t].getMin());
			int j;
			for (j = i; j < sz - 1; ++j) {
				if (iv[t].min < iv[minsorted[j + 1]].min) {
					break;
				}
				minsorted[j] = minsorted[j + 1];
			}
			minsorted[j] = t;
		}
		for (int i = sz - 1; i >= 0; --i) {
			const int t = maxsorted[i];
			iv[t].max = static_cast<int>(x[t].getMax()) + 1;
			int j;
			for (j = i; j < sz - 1; ++j) {
				if (iv[t].max < iv[maxsorted[j + 1]].max) {
					break;
				}
				maxsorted[j] = maxsorted[j + 1];
			}
			maxsorted[j] = t;
		}

		min = iv[minsorted[0]].min;
		max = iv[maxsorted[0]].max;
		bounds[0] = last = min - 2;

		for (i = j = nb = 0;;) {       // merge minsorted[] and maxsorted[] into bounds[]
			if (i < sz && min <= max) {  // make sure minsorted exhausted first
				if (min != last) {
					bounds[++nb] = last = min;
				}
				iv[minsorted[i]].minrank = nb;
				if (++i < sz) {
					min = iv[minsorted[i]].min;
				}
			} else {
				if (max != last) {
					bounds[++nb] = last = max;
				}
				iv[maxsorted[j]].maxrank = nb;
				if (++j == sz) {
					break;
				}
				max = iv[maxsorted[j]].max;
			}
		}
		bounds[nb + 1] = bounds[nb] + 2;
	}